

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::Recycler::ProcessParallelMark(Recycler *this,bool background,MarkContext *markContext)

{
  if (this->enableScanInteriorPointers == true) {
    ProcessMarkContext<true,true>(this,markContext);
    return;
  }
  ProcessMarkContext<true,false>(this,markContext);
  return;
}

Assistant:

void
Recycler::ProcessParallelMark(bool background, MarkContext * markContext)
{
#if ENABLE_CONCURRENT_GC
    if (background)
    {
        GCETW(GC_BACKGROUNDPARALLELMARK_START, (this, backgroundRescanCount));
    }
    else
#endif
    {
        GCETW(GC_PARALLELMARK_START, (this));
    }

    RECYCLER_PROFILE_EXEC_THREAD_BEGIN(background, this, Js::MarkPhase);

    if (this->enableScanInteriorPointers)
    {
        this->ProcessMarkContext</* parallel */ true, /* interior */ true>(markContext);
    }
    else
    {
        this->ProcessMarkContext</* parallel */ true, /* interior */ false>(markContext);
    }

    RECYCLER_PROFILE_EXEC_THREAD_END(background, this, Js::MarkPhase);

#if ENABLE_CONCURRENT_GC
    if (background)
    {
        GCETW(GC_BACKGROUNDPARALLELMARK_STOP, (this, backgroundRescanCount));
    }
    else
#endif
    {
        GCETW(GC_PARALLELMARK_STOP, (this));
    }
}